

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_case_name,string *a_name,char *a_type_param,
          char *a_value_param,CodeLocation *a_code_location,TypeId fixture_class_id,
          TestFactoryBase *factory)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  bool local_63;
  allocator<char> local_62;
  undefined1 local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  byte local_53;
  undefined1 local_52 [26];
  CodeLocation *local_38;
  CodeLocation *a_code_location_local;
  char *a_value_param_local;
  char *a_type_param_local;
  string *a_name_local;
  string *a_test_case_name_local;
  TestInfo *this_local;
  
  local_38 = a_code_location;
  a_code_location_local = (CodeLocation *)a_value_param;
  a_value_param_local = a_type_param;
  a_type_param_local = (char *)a_name;
  a_name_local = a_test_case_name;
  a_test_case_name_local = &this->test_case_name_;
  std::__cxx11::string::string((string *)this,(string *)a_test_case_name);
  std::__cxx11::string::string((string *)&this->name_,(string *)a_type_param_local);
  local_52[1] = 0;
  local_53 = 0;
  if (a_value_param_local == (char *)0x0) {
    p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    local_52[1] = 1;
    in_stack_ffffffffffffff60 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_52;
    in_stack_ffffffffffffff58 = a_value_param_local;
    local_52._2_8_ = p;
    std::allocator<char>::allocator();
    local_53 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  local_52[1] = 0;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(&this->type_param_,p);
  if ((local_53 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_52);
  }
  local_61 = 0;
  local_63 = a_code_location_local == (CodeLocation *)0x0;
  if (local_63) {
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    local_61 = 1;
    local_60 = local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(allocator<char> *)p);
  }
  local_61 = 0;
  local_63 = !local_63;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(&this->value_param_,local_d8);
  if (local_63) {
    std::allocator<char>::~allocator(&local_62);
  }
  internal::CodeLocation::CodeLocation(&this->location_,a_code_location);
  this->fixture_class_id_ = fixture_class_id;
  this->should_run_ = false;
  this->is_disabled_ = false;
  this->matches_filter_ = false;
  this->factory_ = factory;
  TestResult::TestResult(&this->result_);
  return;
}

Assistant:

TestInfo::TestInfo(const std::string& a_test_case_name,
                   const std::string& a_name,
                   const char* a_type_param,
                   const char* a_value_param,
                   internal::CodeLocation a_code_location,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_case_name_(a_test_case_name),
      name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : NULL),
      value_param_(a_value_param ? new std::string(a_value_param) : NULL),
      location_(a_code_location),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      factory_(factory),
      result_() {}